

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

String * __thiscall
glcts::ShaderStorageBufferLayoutBindingCase::buildAccess
          (String *__return_storage_ptr__,ShaderStorageBufferLayoutBindingCase *this,String *var)

{
  ostream *poVar1;
  ostringstream local_198 [8];
  ostringstream s;
  String *var_local;
  ShaderStorageBufferLayoutBindingCase *this_local;
  
  s._368_8_ = var;
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,"vec4(0.0, ");
  poVar1 = std::operator<<(poVar1,(string *)s._368_8_);
  poVar1 = std::operator<<(poVar1,"_a[0] + ");
  poVar1 = std::operator<<(poVar1,(string *)s._368_8_);
  std::operator<<(poVar1,"_a[1], 0.0, 1.0)");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

String buildAccess(const String& var)
	{
		std::ostringstream s;
		s << "vec4(0.0, " << var << "_a[0] + " << var << "_a[1], 0.0, 1.0)";
		return s.str();
	}